

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O0

Error asmjit::_abi_1_10::InstAPI::queryRWInfo
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,InstRWInfo *out)

{
  bool bVar1;
  ulong in_RCX;
  Arch in_DIL;
  InstRWInfo *in_stack_000000a0;
  size_t in_stack_000000a8;
  Operand_ *in_stack_000000b0;
  BaseInst *in_stack_000000b8;
  Arch in_stack_000000c3;
  InstRWInfo *in_stack_00000400;
  size_t in_stack_00000408;
  Operand_ *in_stack_00000410;
  BaseInst *in_stack_00000418;
  Arch in_stack_00000423;
  undefined4 local_4;
  
  if (in_RCX < 7) {
    bVar1 = Environment::isFamilyX86(in_DIL);
    if (bVar1) {
      local_4 = x86::InstInternal::queryRWInfo
                          (in_stack_00000423,in_stack_00000418,in_stack_00000410,in_stack_00000408,
                           in_stack_00000400);
    }
    else {
      bVar1 = Environment::isFamilyAArch64(kUnknown);
      if (bVar1) {
        local_4 = a64::InstInternal::queryRWInfo
                            (in_stack_000000c3,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8
                             ,in_stack_000000a0);
      }
      else {
        local_4 = DebugUtils::errored(4);
      }
    }
  }
  else {
    local_4 = DebugUtils::errored(2);
  }
  return local_4;
}

Assistant:

Error InstAPI::queryRWInfo(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, InstRWInfo* out) noexcept {
  if (ASMJIT_UNLIKELY(opCount > Globals::kMaxOpCount))
    return DebugUtils::errored(kErrorInvalidArgument);

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::InstInternal::queryRWInfo(arch, inst, operands, opCount, out);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::queryRWInfo(arch, inst, operands, opCount, out);
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}